

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah_spatial.cpp
# Opt level: O1

void __thiscall
embree::avx::
BVHNBuilderFastSpatialSAH<8,_embree::TriangleMesh,_embree::TriangleM<4>,_embree::avx::TriangleSplitterFactory>
::build(BVHNBuilderFastSpatialSAH<8,_embree::TriangleMesh,_embree::TriangleM<4>,_embree::avx::TriangleSplitterFactory>
        *this)

{
  mvector<PrimRef> *prims;
  undefined8 *puVar1;
  undefined8 *puVar2;
  char cVar3;
  BVH *pBVar4;
  pointer ppTVar5;
  Device *pDVar6;
  Block *pBVar7;
  PrimRef *pPVar8;
  MemoryMonitorInterface *pMVar9;
  TriangleMesh *pTVar10;
  Geometry *pGVar11;
  BVHN<8> *this_00;
  Scene *pSVar12;
  double dVar13;
  float fVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  long lVar18;
  long *plVar19;
  ulong uVar20;
  PrimRef *pPVar21;
  size_t sVar22;
  NodeRef root;
  long *plVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  size_t sVar25;
  ulong uVar26;
  ulong uVar27;
  EVP_PKEY_CTX *ctx;
  uint uVar28;
  __pointer_type pBVar29;
  size_t sVar30;
  uint uVar31;
  pointer ppTVar32;
  size_t *psVar33;
  bool bVar34;
  PrimInfo pinfo;
  string __str;
  BuildProgressMonitor *in_stack_fffffffffffffe68;
  BuildProgressMonitor *in_stack_fffffffffffffe70;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_128;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  size_t local_f8;
  size_t sStack_f0;
  size_t *local_e8;
  double local_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_88;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_68;
  size_t local_58;
  size_t sStack_50;
  undefined **local_40;
  Scene *local_38;
  
  if ((this->mesh != (TriangleMesh *)0x0) &&
     ((this->mesh->super_Geometry).numPrimitives != this->numPreviousPrimitives)) {
    pBVar4 = this->bvh;
    FastAllocator::internal_fix_used_blocks(&pBVar4->alloc);
    ppTVar5 = (pBVar4->alloc).thread_local_allocators.
              super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppTVar32 = (pBVar4->alloc).thread_local_allocators.
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppTVar32 != ppTVar5;
        ppTVar32 = ppTVar32 + 1) {
      FastAllocator::ThreadLocal2::unbind(*ppTVar32,&pBVar4->alloc);
    }
    ppTVar32 = (pBVar4->alloc).thread_local_allocators.
               super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((pBVar4->alloc).thread_local_allocators.
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppTVar32) {
      (pBVar4->alloc).thread_local_allocators.
      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppTVar32;
    }
    LOCK();
    (pBVar4->alloc).bytesUsed.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (pBVar4->alloc).bytesFree.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (pBVar4->alloc).bytesWasted.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    if ((pBVar4->alloc).usedBlocks._M_b._M_p != (__pointer_type)0x0) {
      pDVar6 = (pBVar4->alloc).device;
      bVar34 = (pBVar4->alloc).useUSM;
      pBVar29 = (pBVar4->alloc).usedBlocks._M_b._M_p;
      do {
        pBVar7 = pBVar29->next;
        FastAllocator::Block::clear_block(pBVar29,pDVar6,bVar34);
        pBVar29 = pBVar7;
      } while (pBVar7 != (Block *)0x0);
    }
    LOCK();
    (pBVar4->alloc).usedBlocks._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if ((pBVar4->alloc).freeBlocks._M_b._M_p != (__pointer_type)0x0) {
      pDVar6 = (pBVar4->alloc).device;
      bVar34 = (pBVar4->alloc).useUSM;
      pBVar29 = (pBVar4->alloc).freeBlocks._M_b._M_p;
      do {
        pBVar7 = pBVar29->next;
        FastAllocator::Block::clear_block(pBVar29,pDVar6,bVar34);
        pBVar29 = pBVar7;
      } while (pBVar7 != (Block *)0x0);
    }
    LOCK();
    (pBVar4->alloc).freeBlocks._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    lVar18 = -8;
    do {
      LOCK();
      (pBVar4->alloc).threadBlocks[lVar18]._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      LOCK();
      (pBVar4->alloc).threadBlocks[lVar18 + 8]._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      lVar18 = lVar18 + 1;
    } while (lVar18 != 0);
    sVar22 = (pBVar4->alloc).primrefarray.size_alloced;
    pPVar8 = (pBVar4->alloc).primrefarray.items;
    if (pPVar8 != (PrimRef *)0x0) {
      if (sVar22 << 5 < 0x1c00000) {
        alignedFree(pPVar8);
      }
      else {
        os_free(pPVar8,sVar22 << 5,(pBVar4->alloc).primrefarray.alloc.hugepages);
      }
    }
    if (sVar22 != 0) {
      pMVar9 = (pBVar4->alloc).primrefarray.alloc.device;
      (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar22 * -0x20,1);
    }
    (pBVar4->alloc).primrefarray.size_active = 0;
    (pBVar4->alloc).primrefarray.size_alloced = 0;
    (pBVar4->alloc).primrefarray.items = (PrimRef *)0x0;
  }
  pTVar10 = this->mesh;
  if (pTVar10 == (TriangleMesh *)0x0) {
    sVar22 = (this->scene->world).numTriangles;
  }
  else {
    sVar22 = (size_t)(pTVar10->super_Geometry).numPrimitives;
  }
  this->numPreviousPrimitives = (uint)sVar22;
  if (sVar22 != 0) {
    if (pTVar10 == (TriangleMesh *)0x0) {
      sVar30 = (this->scene->geometries).size_active;
      if (sVar30 == 0) {
        uVar31 = 0;
      }
      else {
        uVar31 = 0;
        sVar25 = 0;
        do {
          pGVar11 = (this->scene->geometries).items[sVar25].ptr;
          bVar34 = true;
          if (((pGVar11 != (Geometry *)0x0) && (((pGVar11->field_8).field_0x2 & 0x20) != 0)) &&
             (*(char *)&pGVar11->field_8 == '\x14')) {
            bVar34 = pGVar11->numTimeSteps != 1;
          }
          uVar28 = uVar31;
          if (uVar31 <= (uint)sVar25) {
            uVar28 = (uint)sVar25;
          }
          if (!bVar34) {
            uVar31 = uVar28;
          }
          sVar25 = sVar25 + 1;
        } while (sVar30 != sVar25);
      }
    }
    else {
      uVar31 = this->geomID_;
    }
    this_00 = this->bvh;
    cVar3 = *(char *)(*(long *)&(this->scene->super_AccelN).field_0x188 + 0x464);
    if (pTVar10 == (TriangleMesh *)0x0) {
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct((ulong)local_b8,'\x01');
      *local_b8[0] = 0x38;
      plVar19 = (long *)std::__cxx11::string::replace((ulong)local_b8,0,(char *)0x0,0x2021eed);
      local_d8 = &local_c8;
      plVar23 = plVar19 + 2;
      if ((long *)*plVar19 == plVar23) {
        local_c8 = *plVar23;
        lStack_c0 = plVar19[3];
      }
      else {
        local_c8 = *plVar23;
        local_d8 = (long *)*plVar19;
      }
      local_d0 = plVar19[1];
      *plVar19 = (long)plVar23;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      plVar19 = (long *)std::__cxx11::string::append((char *)&local_d8);
      local_138._0_8_ = &aStack_128;
      paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar19 == paVar24) {
        aStack_128._M_allocated_capacity = paVar24->_M_allocated_capacity;
        aStack_128._8_8_ = plVar19[3];
      }
      else {
        aStack_128._M_allocated_capacity = paVar24->_M_allocated_capacity;
        local_138._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar19;
      }
      local_138._8_8_ = plVar19[1];
      *plVar19 = (long)paVar24;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
    }
    else {
      local_138._0_8_ = &aStack_128;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"");
    }
    local_e0 = BVHN<8>::preBuild(this_00,(string *)&local_138.field_1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._0_8_ != &aStack_128) {
      operator_delete((void *)local_138._0_8_);
    }
    if (pTVar10 == (TriangleMesh *)0x0) {
      if (local_d8 != &local_c8) {
        operator_delete(local_d8);
      }
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0]);
      }
    }
    fVar14 = (float)sVar22 * this->splitFactor;
    uVar20 = (ulong)fVar14;
    uVar20 = (long)(fVar14 - 9.223372e+18) & (long)uVar20 >> 0x3f | uVar20;
    if (uVar20 < sVar22) {
      uVar20 = sVar22;
    }
    uVar26 = (this->prims0).size_alloced;
    uVar27 = uVar26;
    if ((uVar26 < uVar20) && (uVar27 = uVar20, uVar26 != 0)) {
      for (; uVar27 = uVar26, uVar26 < uVar20; uVar26 = uVar26 * 2 + (ulong)(uVar26 * 2 == 0)) {
      }
    }
    psVar33 = &(this->prims0).size_active;
    if (uVar20 < (this->prims0).size_active) {
      *psVar33 = uVar20;
    }
    prims = &this->prims0;
    if ((this->prims0).size_alloced == uVar27) {
      *psVar33 = uVar20;
    }
    else {
      pPVar8 = (this->prims0).items;
      local_e8 = psVar33;
      if (uVar27 != 0) {
        pMVar9 = (prims->alloc).device;
        (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,uVar27 << 5,0);
      }
      sVar30 = uVar27 << 5;
      if (sVar30 < 0x1c00000) {
        pPVar21 = (PrimRef *)alignedMalloc(sVar30,0x20);
      }
      else {
        pPVar21 = (PrimRef *)os_malloc(sVar30,&(this->prims0).alloc.hugepages);
      }
      (this->prims0).items = pPVar21;
      if ((this->prims0).size_active != 0) {
        lVar18 = 0;
        uVar26 = 0;
        do {
          puVar2 = (undefined8 *)((long)&(pPVar8->lower).field_0 + lVar18);
          uVar15 = puVar2[1];
          uVar16 = puVar2[2];
          uVar17 = puVar2[3];
          puVar1 = (undefined8 *)((long)&(((this->prims0).items)->lower).field_0 + lVar18);
          *puVar1 = *puVar2;
          puVar1[1] = uVar15;
          puVar1[2] = uVar16;
          puVar1[3] = uVar17;
          uVar26 = uVar26 + 1;
          lVar18 = lVar18 + 0x20;
        } while (uVar26 < (this->prims0).size_active);
      }
      sVar30 = (this->prims0).size_alloced;
      if (pPVar8 != (PrimRef *)0x0) {
        if (sVar30 << 5 < 0x1c00000) {
          alignedFree(pPVar8);
        }
        else {
          os_free(pPVar8,sVar30 << 5,(this->prims0).alloc.hugepages);
        }
      }
      if (sVar30 != 0) {
        pMVar9 = (prims->alloc).device;
        (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar30 * -0x20,1);
      }
      (this->prims0).size_active = uVar20;
      (this->prims0).size_alloced = uVar27;
      psVar33 = local_e8;
    }
    if (this->mesh != (TriangleMesh *)0x0) {
      (this->bvh->alloc).atype = EMBREE_OS_MALLOC;
    }
    if (uVar31 < 0x8000000 && cVar3 == '\0') {
      if (this->mesh == (TriangleMesh *)0x0) {
        avx::createPrimRefArray
                  ((PrimInfo *)&local_98,this->scene,MTY_TRIANGLE_MESH,false,uVar20,prims,
                   &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
      }
      else {
        avx::createPrimRefArray
                  ((PrimInfo *)&local_98,&this->mesh->super_Geometry,this->geomID_,uVar20,prims,
                   &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
      }
      local_138._0_8_ = local_98._0_8_;
      local_138._8_8_ = local_98._8_8_;
      aStack_128._M_allocated_capacity = aStack_88._0_8_;
      aStack_128._8_8_ = aStack_88._8_8_;
      local_118 = local_78._0_8_;
      uStack_110 = local_78._8_8_;
      uStack_108 = aStack_68._0_8_;
      uStack_100 = aStack_68._8_8_;
      local_f8 = local_58;
      sStack_f0 = sStack_50;
      pSVar12 = this->scene;
      dVar13 = (double)((sStack_50 - local_58) + 3 >> 2) * 1.2 * 176.0;
      uVar26 = (ulong)dVar13;
      sVar22 = ((long)(dVar13 - 9.223372036854776e+18) & (long)uVar26 >> 0x3f | uVar26) +
               (sStack_50 - local_58 & 0xffffffffffffff) * 8;
      FastAllocator::init_estimate(&this->bvh->alloc,sVar22);
      sVar22 = FastAllocator::fixSingleThreadThreshold
                         (&this->bvh->alloc,8,0x400,sStack_f0 - local_f8,sVar22);
      (this->settings).singleThreadThreshold = sVar22;
      (this->settings).branchingFactor = 8;
      (this->settings).maxDepth = 0x28;
      local_98._0_8_ = this->bvh;
      local_40 = &PTR_operator___02202970;
      local_38 = (((BVH *)local_98._0_8_)->scene->progressInterface).scene;
      root.ptr = (size_t)BVHBuilderBinnedFastSpatialSAH::
                         build<embree::NodeRefPtr<8>,embree::BVHN<8>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<8>,8>::Create2,embree::AABBNode_t<embree::NodeRefPtr<8>,8>::Set2,embree::avx::CreateLeafSpatial<8,embree::TriangleM<4>>,embree::avx::TriangleSplitterFactory,embree::Scene::BuildProgressMonitorInterface>
                                   (&((BVH *)local_98._0_8_)->alloc,&local_98,pSVar12,&local_40,
                                    (this->prims0).items,uVar20,&local_138,&this->settings);
    }
    else {
      if (this->mesh == (TriangleMesh *)0x0) {
        createPrimRefArray_presplit<embree::TriangleMesh,embree::avx::TriangleSplitterFactory>
                  ((PrimInfo *)&local_98,(avx *)this->scene,(Scene *)&Geometry::updateBuffer,
                   ~MTY_ALL,SUB81(sVar22,0),(size_t)prims,
                   (mvector<PrimRef> *)&this->bvh->scene->progressInterface,
                   in_stack_fffffffffffffe70);
      }
      else {
        createPrimRefArray_presplit<embree::TriangleMesh,embree::avx::TriangleSplitterFactory>
                  ((PrimInfo *)&local_98,(avx *)this->mesh,(Geometry *)(ulong)uVar31,(uint)sVar22,
                   (size_t)prims,(mvector<PrimRef> *)&this->bvh->scene->progressInterface,
                   in_stack_fffffffffffffe68);
      }
      local_138._0_8_ = local_98._0_8_;
      local_138._8_8_ = local_98._8_8_;
      aStack_128._M_allocated_capacity = aStack_88._0_8_;
      aStack_128._8_8_ = aStack_88._8_8_;
      local_118 = local_78._0_8_;
      uStack_110 = local_78._8_8_;
      uStack_108 = aStack_68._0_8_;
      uStack_100 = aStack_68._8_8_;
      local_f8 = local_58;
      sStack_f0 = sStack_50;
      dVar13 = (double)((sStack_50 - local_58) + 3 >> 2) * 1.2 * 176.0;
      uVar20 = (ulong)dVar13;
      sVar22 = ((long)(dVar13 - 9.223372036854776e+18) & (long)uVar20 >> 0x3f | uVar20) +
               (sStack_50 - local_58 & 0xffffffffffffff) * 8;
      FastAllocator::init_estimate(&this->bvh->alloc,sVar22);
      sVar22 = FastAllocator::fixSingleThreadThreshold
                         (&this->bvh->alloc,8,0x400,sStack_f0 - local_f8,sVar22);
      (this->settings).singleThreadThreshold = sVar22;
      (this->settings).branchingFactor = 8;
      (this->settings).maxDepth = 0x28;
      local_98._8_8_ = this->bvh;
      local_98._0_8_ = &PTR_createLeaf_022145a0;
      root.ptr = (size_t)BVHNBuilderVirtual<8>::BVHNBuilderV::build
                                   ((BVHNBuilderV *)&local_98,&((BVH *)local_98._8_8_)->alloc,
                                    &(((BVH *)local_98._8_8_)->scene->progressInterface).
                                     super_BuildProgressMonitor,(this->prims0).items,
                                    (PrimInfo *)&local_138.field_1,this->settings);
    }
    local_98._0_8_ = local_138._0_8_;
    local_98._8_8_ = local_138._8_8_;
    aStack_88._0_8_ = aStack_128._M_allocated_capacity;
    aStack_88._8_8_ = aStack_128._8_8_;
    local_78._0_8_ = local_138._0_8_;
    local_78._8_8_ = local_138._8_8_;
    aStack_68._0_8_ = aStack_128._M_allocated_capacity;
    aStack_68._8_8_ = aStack_128._8_8_;
    BVHN<8>::set(this->bvh,root,(LBBox3fa *)&local_98,sStack_f0 - local_f8);
    fVar14 = (float)(sStack_f0 - local_f8) * 0.005;
    uVar20 = (ulong)fVar14;
    ctx = (EVP_PKEY_CTX *)((long)(fVar14 - 9.223372e+18) & (long)uVar20 >> 0x3f | uVar20);
    BVHN<8>::layoutLargeNodes(this->bvh,(size_t)ctx);
    if ((this->scene != (Scene *)0x0) &&
       ((this->scene->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE)) {
      sVar22 = (this->prims0).size_alloced;
      pPVar8 = (this->prims0).items;
      if (pPVar8 != (PrimRef *)0x0) {
        ctx = (EVP_PKEY_CTX *)(sVar22 << 5);
        if (ctx < (EVP_PKEY_CTX *)0x1c00000) {
          alignedFree(pPVar8);
        }
        else {
          os_free(pPVar8,(size_t)ctx,(this->prims0).alloc.hugepages);
        }
      }
      if (sVar22 != 0) {
        pMVar9 = (prims->alloc).device;
        ctx = (EVP_PKEY_CTX *)(sVar22 * -0x20);
        (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,ctx,1);
      }
      *psVar33 = 0;
      psVar33[1] = 0;
      psVar33[2] = 0;
    }
    BVHN<8>::cleanup(this->bvh,ctx);
    BVHN<8>::postBuild(this->bvh,local_e0);
    return;
  }
  sVar22 = (this->prims0).size_alloced;
  pPVar8 = (this->prims0).items;
  if (pPVar8 != (PrimRef *)0x0) {
    if (sVar22 << 5 < 0x1c00000) {
      alignedFree(pPVar8);
    }
    else {
      os_free(pPVar8,sVar22 << 5,(this->prims0).alloc.hugepages);
    }
  }
  if (sVar22 != 0) {
    pMVar9 = (this->prims0).alloc.device;
    (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar22 * -0x20,1);
  }
  (this->prims0).size_active = 0;
  (this->prims0).size_alloced = 0;
  (this->prims0).items = (PrimRef *)0x0;
  (*(this->bvh->super_AccelData).super_RefCount._vptr_RefCount[5])();
  return;
}

Assistant:

void build()
      {
        /* we reset the allocator when the mesh size changed */
        if (mesh && mesh->numPrimitives != numPreviousPrimitives) {
          bvh->alloc.clear();
        }

	/* skip build for empty scene */
        const size_t numOriginalPrimitives = mesh ? mesh->size() : scene->getNumPrimitives(Mesh::geom_type,false);
        numPreviousPrimitives = numOriginalPrimitives;
        if (numOriginalPrimitives == 0) {
          prims0.clear();
          bvh->clear();
          return;
        }

        const unsigned int maxGeomID = mesh ? geomID_ : scene->getMaxGeomID<Mesh,false>();
        const bool usePreSplits = scene->device->useSpatialPreSplits || (maxGeomID >= ((unsigned int)1 << (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS)));
        double t0 = bvh->preBuild(mesh ? "" : TOSTRING(isa) "::BVH" + toString(N) + (usePreSplits ? "BuilderFastSpatialPresplitSAH" : "BuilderFastSpatialSAH"));

        /* create primref array */
        const size_t numSplitPrimitives = max(numOriginalPrimitives,size_t(splitFactor*numOriginalPrimitives));
        prims0.resize(numSplitPrimitives);

        /* enable os_malloc for two level build */
        if (mesh)
          bvh->alloc.setOSallocation(true);
	
	NodeRef root(0);
	PrimInfo pinfo;
	

        if (likely(usePreSplits))
	  {		     
            /* spatial presplit SAH BVH builder */
	    pinfo = mesh ?
	      createPrimRefArray_presplit<Mesh,Splitter>(mesh,maxGeomID,numOriginalPrimitives,prims0,bvh->scene->progressInterface) :
	      createPrimRefArray_presplit<Mesh,Splitter>(scene,Mesh::geom_type,false,numOriginalPrimitives,prims0,bvh->scene->progressInterface);

	    const size_t node_bytes = pinfo.size()*sizeof(typename BVH::AABBNode)/(4*N);
	    const size_t leaf_bytes = size_t(1.2*Primitive::blocks(pinfo.size())*sizeof(Primitive));
	    bvh->alloc.init_estimate(node_bytes+leaf_bytes);
	    settings.singleThreadThreshold = bvh->alloc.fixSingleThreadThreshold(N,DEFAULT_SINGLE_THREAD_THRESHOLD,pinfo.size(),node_bytes+leaf_bytes);

	    settings.branchingFactor = N;
	    settings.maxDepth = BVH::maxBuildDepthLeaf;

	    /* call BVH builder */
	    root = BVHNBuilderVirtual<N>::build(&bvh->alloc,CreateLeafSpatial<N,Primitive>(bvh),bvh->scene->progressInterface,prims0.data(),pinfo,settings);
	  }
	else
	  {
            /* standard spatial split SAH BVH builder */
	    pinfo = mesh ?
	      createPrimRefArray(mesh,geomID_,numSplitPrimitives,prims0,bvh->scene->progressInterface) :
	      createPrimRefArray(scene,Mesh::geom_type,false,numSplitPrimitives,prims0,bvh->scene->progressInterface);
	
	    Splitter splitter(scene);

	    const size_t node_bytes = pinfo.size()*sizeof(typename BVH::AABBNode)/(4*N);
	    const size_t leaf_bytes = size_t(1.2*Primitive::blocks(pinfo.size())*sizeof(Primitive));
	    bvh->alloc.init_estimate(node_bytes+leaf_bytes);
	    settings.singleThreadThreshold = bvh->alloc.fixSingleThreadThreshold(N,DEFAULT_SINGLE_THREAD_THRESHOLD,pinfo.size(),node_bytes+leaf_bytes);

	    settings.branchingFactor = N;
	    settings.maxDepth = BVH::maxBuildDepthLeaf;

	    /* call BVH builder */
	    root = BVHBuilderBinnedFastSpatialSAH::build<NodeRef>(
								  typename BVH::CreateAlloc(bvh),
								  typename BVH::AABBNode::Create2(),
								  typename BVH::AABBNode::Set2(),
								  CreateLeafSpatial<N,Primitive>(bvh),
								  splitter,
								  bvh->scene->progressInterface,
								  prims0.data(),
								  numSplitPrimitives,
								  pinfo,settings);

	    /* ==================== */
	  }

        bvh->set(root,LBBox3fa(pinfo.geomBounds),pinfo.size());
        bvh->layoutLargeNodes(size_t(pinfo.size()*0.005f));

	/* clear temporary data for static geometry */
	if (scene && scene->isStaticAccel()) {
          prims0.clear();
        }
	bvh->cleanup();
        bvh->postBuild(t0);
      }